

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH32_hash_t VELOCYPACK_XXH32(void *input,size_t len,XXH32_hash_t seed)

{
  xxh_u32 xVar1;
  XXH_alignment in_stack_00000020;
  xxh_u32 in_stack_00000024;
  size_t in_stack_00000028;
  xxh_u8 *in_stack_00000030;
  
  xVar1 = XXH32_endian_align(in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000020
                            );
  return xVar1;
}

Assistant:

XXH_PUBLIC_API XXH32_hash_t XXH32(const void* input, size_t len,
                                  XXH32_hash_t seed) {
#if 0
    /* Simple version, good for code maintenance, but unfortunately slow for small inputs */
    XXH32_state_t state;
    XXH32_reset(&state, seed);
    XXH32_update(&state, (const xxh_u8*)input, len);
    return XXH32_digest(&state);
#else
  if (XXH_FORCE_ALIGN_CHECK) {
    if ((((size_t)input) & 3) ==
        0) { /* Input is 4-bytes aligned, leverage the speed benefit */
      return XXH32_endian_align((const xxh_u8*)input, len, seed, XXH_aligned);
    }
  }

  return XXH32_endian_align((const xxh_u8*)input, len, seed, XXH_unaligned);
#endif
}